

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleProducerConsumer3.cpp
# Opt level: O1

int main(void)

{
  Queue<int> *pQVar1;
  Queue<int> *pQVar2;
  thread consThr;
  thread prodThr;
  Consumer cons;
  Producer prod;
  Queue<int> q;
  reference_wrapper<Producer> local_110;
  thread local_108;
  Consumer local_100;
  reference_wrapper<Consumer> local_f8;
  Producer local_f0;
  Queue<int> local_e0;
  
  local_e0.queue_.super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl
  ._M_node._M_size = 0;
  local_e0.subscribersNextRead_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e0.subscribersNextRead_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_e0.subscribersNextRead_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e0.subscribersNextRead_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_e0.subscribersNextRead_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0.subscribersMissingRead_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e0.subscribersMissingRead_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_e0.subscribersMissingRead_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e0.subscribersMissingRead_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_e0.subscribersMissingRead_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0.mutex_.super___mutex_base._M_mutex.__align = 0;
  local_e0.mutex_.super___mutex_base._M_mutex._8_8_ = 0;
  local_e0.mutex_.super___mutex_base._M_mutex._16_8_ = 0;
  local_e0.mutex_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_e0.mutex_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_e0.queue_.super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl
  ._M_node.super__List_node_base._M_next = (_List_node_base *)&local_e0;
  local_e0.queue_.super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl
  ._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_e0;
  local_e0.subscribersNextRead_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e0.subscribersNextRead_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_e0.subscribersMissingRead_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e0.subscribersMissingRead_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::condition_variable::condition_variable(&local_e0.cond_);
  local_110._M_data = &local_f0;
  local_f0.numberOfMessages_ = 10;
  local_100.inputQueue_ = &local_e0;
  local_f0.outputQueue_ = &local_e0;
  std::thread::thread<std::reference_wrapper<Producer>,,void>(&local_108,&local_110);
  local_f8._M_data = &local_100;
  std::thread::thread<std::reference_wrapper<Consumer>,,void>((thread *)&local_110,&local_f8);
  std::thread::join();
  std::thread::join();
  if ((local_110._M_data == (Producer *)0x0) && (local_108._M_id._M_thread == 0)) {
    std::condition_variable::~condition_variable(&local_e0.cond_);
    std::
    _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_int>,_std::_Select1st<std::pair<const_std::thread::id,_int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
    ::~_Rb_tree(&local_e0.subscribersMissingRead_._M_t);
    std::
    _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>,_std::_Select1st<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
    ::~_Rb_tree(&local_e0.subscribersNextRead_._M_t);
    pQVar2 = (Queue<int> *)
             local_e0.queue_.
             super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl.
             _M_node.super__List_node_base._M_next;
    while (pQVar2 != &local_e0) {
      pQVar1 = (Queue<int> *)
               (pQVar2->queue_).
               super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl.
               _M_node.super__List_node_base._M_next;
      operator_delete(pQVar2,0x18);
      pQVar2 = pQVar1;
    }
    return 0;
  }
  std::terminate();
}

Assistant:

int main() {
    // Define the queue as a variable in the main scope
    Queue<int> q;

    Producer prod(10, q);
    Consumer cons(q);

    // Run `produce` function on a new thread providing a function argument
    std::thread prodThr(std::ref(prod));
    // Run `consume` function on a new thread
    std::thread consThr(std::ref(cons));

    // Wait for the threads to terminate before exiting the main function
    prodThr.join();
    consThr.join();

    return 0;
}